

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.h
# Opt level: O2

LoopHeader * __thiscall
Memory::AllocateArray<Memory::Recycler,Js::LoopHeader,false>
          (Memory *this,Recycler *allocator,AllocFuncType AllocFunc,size_t count)

{
  undefined1 auVar1 [16];
  LoopHeader *pLVar2;
  LoopHeader *pLVar3;
  size_t byteSize;
  
  if (count == 0) {
    Recycler::ClearTrackAllocInfo((Recycler *)this,(TrackAllocData *)0x0);
    pLVar2 = (LoopHeader *)0x8;
  }
  else {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = count;
    byteSize = 0xffffffffffffffff;
    if (SUB168(auVar1 * ZEXT816(0x30),8) == 0) {
      byteSize = SUB168(auVar1 * ZEXT816(0x30),0);
    }
    pLVar2 = (LoopHeader *)
             new__<Memory::Recycler>
                       (byteSize,(Recycler *)this,(offset_in_Recycler_to_subr)allocator);
    pLVar3 = pLVar2;
    do {
      (pLVar3->entryPoints).ptr =
           (SynchronizableList<Js::LoopEntryPointInfo_*,_JsUtil::List<Js::LoopEntryPointInfo_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_Js::DefaultContainerLockPolicy,_CriticalSection>
            *)0x0;
      (pLVar3->functionBody).ptr = (FunctionBody *)0x0;
      pLVar3 = pLVar3 + 1;
    } while (pLVar3 != pLVar2 + count);
  }
  return pLVar2;
}

Assistant:

inline T * AllocateArray(TAllocator * allocator, char * (TAllocator::*AllocFunc)(size_t), DECLSPEC_GUARD_OVERFLOW size_t count)
{
    if (count == 0 && TAllocator::FakeZeroLengthArray)
    {
#ifdef TRACK_ALLOC
        allocator->ClearTrackAllocInfo();
#endif
        // C++ standard requires allocator to return non-null if it isn't out of memory
        // Just return some small number so we will still AV if someone try to use the memory
        return (T *)ZERO_LENGTH_ARRAY;
    }
    if (nothrow)
    {
        return new (allocator, nothrow, AllocFunc) T[count];
    }
    return new (allocator, AllocFunc) T[count];
}